

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

void nifti_swap_Nbytes(size_t n,int siz,void *ar)

{
  ushort *puVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 *puVar9;
  size_t sVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  undefined1 auVar13 [16];
  
  switch(siz - 2U >> 1 | (uint)((siz - 2U & 1) != 0) << 0x1f) {
  case 0:
    if (n != 0) {
      sVar10 = 0;
      do {
        puVar1 = (ushort *)((long)ar + sVar10 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        sVar10 = sVar10 + 1;
      } while (n != sVar10);
    }
    break;
  case 1:
    if (n != 0) {
      sVar10 = 0;
      do {
        uVar3 = *(undefined4 *)((long)ar + sVar10 * 4);
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        auVar13 = pshuflw(auVar13,auVar13,0x1b);
        sVar5 = auVar13._0_2_;
        sVar6 = auVar13._2_2_;
        sVar7 = auVar13._4_2_;
        sVar8 = auVar13._6_2_;
        *(uint *)((long)ar + sVar10 * 4) =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar13[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar13[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar13[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar13[0] - (0xff < sVar5))
                              ));
        sVar10 = sVar10 + 1;
      } while (n != sVar10);
    }
    break;
  default:
    fprintf(_stderr,"** NIfTI: cannot swap in %d byte blocks\n",siz);
    return;
  case 3:
    if (n != 0) {
      puVar9 = (undefined1 *)((long)ar + 1);
      sVar10 = 0;
      do {
        puVar11 = (undefined1 *)((long)ar + 7);
        puVar12 = puVar9;
        do {
          uVar2 = puVar12[-1];
          puVar12[-1] = *puVar11;
          *puVar11 = uVar2;
          puVar11 = puVar11 + -1;
          bVar4 = puVar12 < puVar11;
          puVar12 = puVar12 + 1;
        } while (bVar4);
        ar = (void *)((long)ar + 8);
        sVar10 = sVar10 + 1;
        puVar9 = puVar9 + 8;
      } while (sVar10 != n);
    }
    break;
  case 7:
    if (n != 0) {
      puVar9 = (undefined1 *)((long)ar + 1);
      sVar10 = 0;
      do {
        puVar11 = (undefined1 *)((long)ar + 0xf);
        puVar12 = puVar9;
        do {
          uVar2 = puVar12[-1];
          puVar12[-1] = *puVar11;
          *puVar11 = uVar2;
          puVar11 = puVar11 + -1;
          bVar4 = puVar12 < puVar11;
          puVar12 = puVar12 + 1;
        } while (bVar4);
        ar = (void *)((long)ar + 0x10);
        sVar10 = sVar10 + 1;
        puVar9 = puVar9 + 0x10;
      } while (sVar10 != n);
    }
  }
  return;
}

Assistant:

void nifti_swap_Nbytes( size_t n , int siz , void *ar )  /* subsuming case */
{
   switch( siz ){
     case 2:  nifti_swap_2bytes ( n , ar ) ; break ;
     case 4:  nifti_swap_4bytes ( n , ar ) ; break ;
     case 8:  nifti_swap_8bytes ( n , ar ) ; break ;
     case 16: nifti_swap_16bytes( n , ar ) ; break ;
     default:    /* nifti_swap_bytes  ( n , siz, ar ) ; */
        fprintf(stderr,"** NIfTI: cannot swap in %d byte blocks\n", siz);
        break ;
   }
   return ;
}